

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O1

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::selection(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
            *this)

{
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  local_48;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  ::select((DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
            *)&local_28,(int)this,(fd_set *)&this->_population,in_RCX,in_R8,in_R9);
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_28;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_20;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  local_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&local_48);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector((vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             *)&local_28);
  return;
}

Assistant:

void selection()
    {
        //Select the most fittest individual
        _fittestChromosomes = SelectionPolicy::select(_population);
    }